

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

ResultValueBase<Catch::Clara::Detail::ParseState> * __thiscall
Catch::Clara::Detail::ResultValueBase<Catch::Clara::Detail::ParseState>::operator=
          (ResultValueBase<Catch::Clara::Detail::ParseState> *this,
          ResultValueBase<Catch::Clara::Detail::ParseState> *other)

{
  ResultValueBase<Catch::Clara::Detail::ParseState> *other_local;
  ResultValueBase<Catch::Clara::Detail::ParseState> *this_local;
  
  if ((this->super_ResultBase).m_type == Ok) {
    ParseState::~ParseState(&(this->field_0).m_value);
  }
  ResultBase::operator=(&this->super_ResultBase,&other->super_ResultBase);
  if ((this->super_ResultBase).m_type == Ok) {
    ParseState::ParseState(&(this->field_0).m_value,&(other->field_0).m_value);
  }
  return this;
}

Assistant:

auto operator=( ResultValueBase const& other )
                    -> ResultValueBase& {
                    if ( m_type == ResultType::Ok )
                        m_value.~T();
                    ResultBase::operator=( other );
                    if ( m_type == ResultType::Ok )
                        new ( &m_value ) T( other.m_value );
                    return *this;
                }